

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O3

void telnet_free(telnet_t *telnet)

{
  if (telnet->buffer != (char *)0x0) {
    free(telnet->buffer);
    telnet->buffer = (char *)0x0;
    telnet->buffer_size = 0;
    telnet->buffer_pos = 0;
  }
  if (telnet->q != (telnet_rfc1143_t *)0x0) {
    free(telnet->q);
  }
  free(telnet);
  return;
}

Assistant:

void telnet_free(telnet_t *telnet) {
	/* free sub-request buffer */
	if (telnet->buffer != 0) {
		free(telnet->buffer);
		telnet->buffer = 0;
		telnet->buffer_size = 0;
		telnet->buffer_pos = 0;
	}

#if defined(HAVE_ZLIB)
	/* free zlib box */
	if (telnet->z != 0) {
		if (telnet->flags & TELNET_PFLAG_DEFLATE)
			deflateEnd(telnet->z);
		else
			inflateEnd(telnet->z);
		free(telnet->z);
		telnet->z = 0;
	}
#endif /* defined(HAVE_ZLIB) */

	/* free RFC1143 queue */
	if (telnet->q) {
		free(telnet->q);
		telnet->q = NULL;
		telnet->q_size = 0;
		telnet->q_cnt = 0;
	}

	/* free the telnet structure itself */
	free(telnet);
}